

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_function(CompilerGLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  uint32_t file_id;
  StorageClass SVar1;
  TypedID<(spirv_cross::Types)2> *pTVar2;
  size_t sVar3;
  TypedID<(spirv_cross::Types)6> *pTVar4;
  bool bVar5;
  int iVar6;
  SPIRBlock *pSVar7;
  uint32_t *puVar8;
  SPIRFunction *pSVar9;
  mapped_type *pmVar10;
  SPIRConstant *c;
  SPIRType *pSVar11;
  SPIRVariable *pSVar12;
  TypedID<(spirv_cross::Types)2> *pTVar13;
  SPIRBlock *pSVar14;
  TypedID<(spirv_cross::Types)6> *pTVar15;
  char (*in_R8) [12];
  long lVar16;
  Instruction *i;
  Instruction *instr;
  function<void_()> *line;
  ID *pIVar17;
  function<void_()> *this_00;
  TypedID<(spirv_cross::Types)0> *pTVar18;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *dominated;
  string expr;
  string local_70;
  string local_50;
  
  if (func->active == false) {
    func->active = true;
    pTVar15 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
    pTVar4 = pTVar15 + (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>
                       .buffer_size;
    for (; pTVar15 != pTVar4; pTVar15 = pTVar15 + 1) {
      pSVar7 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,pTVar15->id);
      instr = (pSVar7->ops).super_VectorView<spirv_cross::Instruction>.ptr;
      for (lVar16 = (pSVar7->ops).super_VectorView<spirv_cross::Instruction>.buffer_size * 0xc;
          lVar16 != 0; lVar16 = lVar16 + -0xc) {
        puVar8 = Compiler::stream(&this->super_Compiler,instr);
        if (instr->op == 0x39) {
          pSVar9 = Compiler::get<spirv_cross::SPIRFunction>(&this->super_Compiler,puVar8[2]);
          expr._M_dataplus._M_p._0_4_ = puVar8[1];
          pmVar10 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&(this->super_Compiler).ir.meta,(key_type *)&expr);
          emit_function(this,pSVar9,&(pmVar10->decoration).decoration_flags);
        }
        instr = instr + 1;
      }
    }
    file_id = (func->entry_line).file_id;
    if (file_id != 0) {
      emit_line_directive(this,file_id,(func->entry_line).line_literal);
    }
    (*(this->super_Compiler)._vptr_Compiler[7])(this,func,return_flags);
    begin_scope(this);
    if ((func->super_IVariant).self.id == (this->super_Compiler).ir.default_entry_point.id) {
      (*(this->super_Compiler)._vptr_Compiler[0x3d])(this);
    }
    (this->super_Compiler).current_function = func;
    pSVar7 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,(func->entry_block).id);
    pTVar18 = (func->constant_arrays_needed_on_stack).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    ::std::__sort<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_less_iter>
              (pTVar18,pTVar18 + (func->constant_arrays_needed_on_stack).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
                                 buffer_size);
    pTVar18 = (func->constant_arrays_needed_on_stack).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    for (lVar16 = (func->constant_arrays_needed_on_stack).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size << 2;
        lVar16 != 0; lVar16 = lVar16 + -4) {
      c = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,pTVar18->id);
      pSVar11 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(c->super_IVariant).field_0xc);
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[12]>
                (&local_70,(spirv_cross *)0x2ae00b,(char (*) [2])pTVar18,
                 (TypedID<(spirv_cross::Types)0> *)"_array_copy",in_R8);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(&expr,this,pSVar11);
      constant_expression_abi_cxx11_(&local_50,this,c,false,false);
      in_R8 = (char (*) [12])0x2cce52;
      statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (this,&expr,(char (*) [4])0x2c1cbd,&local_50,(char (*) [2])0x2cce52);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&expr);
      ::std::__cxx11::string::~string((string *)&local_70);
      pTVar18 = pTVar18 + 1;
    }
    pTVar2 = (func->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
             ptr;
    sVar3 = (func->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
            buffer_size;
    for (lVar16 = 0; sVar3 << 2 != lVar16; lVar16 = lVar16 + 4) {
      pSVar12 = Compiler::get<spirv_cross::SPIRVariable>
                          (&this->super_Compiler,*(uint32_t *)((long)&pTVar2->id + lVar16));
      pSVar12->deferred_declaration = false;
      iVar6 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,pSVar12,4);
      if ((char)iVar6 == '\0') {
        if (pSVar12->storage == StorageClassFunction) {
          if ((pSVar12->remapped_variable != true) || ((pSVar12->static_expression).id == 0))
          goto LAB_00224004;
          goto LAB_00223f6c;
        }
        if (pSVar12->storage == StorageClassPrivate) {
          add_local_variable_name(this,(pSVar12->super_IVariant).self.id);
          if ((pSVar12->initializer).id != 0) {
            (*(this->super_Compiler)._vptr_Compiler[0x27])(&expr,this,pSVar12);
            statement<std::__cxx11::string,char_const(&)[2]>(this,&expr,(char (*) [2])0x2cce52);
            goto LAB_00223f64;
          }
          pIVar17 = &(pSVar12->super_IVariant).self;
          pTVar13 = (pSVar7->dominated_variables).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
          pTVar13 = ::std::
                    __find_if<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                              (pTVar13,pTVar13 + (pSVar7->dominated_variables).
                                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
                                                 .buffer_size,pIVar17);
          if (pTVar13 ==
              (pSVar7->dominated_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr +
              (pSVar7->dominated_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size) {
            expr._M_dataplus._M_p._0_4_ = pIVar17->id;
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::push_back
                      (&pSVar7->dominated_variables,(TypedID<(spirv_cross::Types)2> *)&expr);
          }
          pSVar12->deferred_declaration = true;
        }
        else {
LAB_00224004:
          bVar5 = Compiler::expression_is_lvalue
                            (&this->super_Compiler,*(uint32_t *)((long)&pTVar2->id + lVar16));
          if (bVar5) {
            add_local_variable_name(this,(pSVar12->super_IVariant).self.id);
            if (((pSVar12->initializer).id == 0) || (pSVar12->loop_variable != false)) {
              pSVar12->deferred_declaration = true;
            }
            else {
              SVar1 = pSVar12->storage;
              pSVar12->storage = StorageClassFunction;
              (*(this->super_Compiler)._vptr_Compiler[0x27])(&expr,this,pSVar12);
              pSVar12->storage = SVar1;
              statement<std::__cxx11::string,char_const(&)[2]>(this,&expr,(char (*) [2])0x2cce52);
              ::std::__cxx11::string::~string((string *)&expr);
            }
          }
          else {
            pSVar12->statically_assigned = true;
          }
        }
      }
      else {
        add_local_variable_name(this,(pSVar12->super_IVariant).self.id);
        (*(this->super_Compiler)._vptr_Compiler[0x27])(&expr,this,pSVar12);
        statement<std::__cxx11::string,char_const(&)[2]>(this,&expr,(char (*) [2])0x2cce52);
LAB_00223f64:
        ::std::__cxx11::string::~string((string *)&expr);
LAB_00223f6c:
        pSVar12->deferred_declaration = false;
      }
      pSVar12->loop_variable_enable = false;
      if (pSVar12->loop_variable == true) {
        pSVar12->deferred_declaration = false;
        (pSVar12->static_expression).id = 0;
      }
    }
    pTVar4 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
    sVar3 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
            buffer_size;
    for (lVar16 = 0; sVar3 << 2 != lVar16; lVar16 = lVar16 + 4) {
      pSVar14 = Compiler::get<spirv_cross::SPIRBlock>
                          (&this->super_Compiler,*(uint32_t *)((long)&pTVar4->id + lVar16));
      pTVar2 = (pSVar14->dominated_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      ::std::__sort<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_less_iter>
                (pTVar2,pTVar2 + (pSVar14->dominated_variables).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
                                 buffer_size);
    }
    pSVar9 = (this->super_Compiler).current_function;
    this_00 = (pSVar9->fixup_hooks_in).super_VectorView<std::function<void_()>_>.ptr;
    for (lVar16 = (pSVar9->fixup_hooks_in).super_VectorView<std::function<void_()>_>.buffer_size <<
                  5; lVar16 != 0; lVar16 = lVar16 + -0x20) {
      ::std::function<void_()>::operator()(this_00);
      this_00 = this_00 + 1;
    }
    emit_block_chain(this,pSVar7);
    end_scope(this);
    this->processing_entry_point = false;
    statement<char_const(&)[1]>(this,(char (*) [1])0x2a9b09);
    pTVar2 = (func->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
             ptr;
    sVar3 = (func->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
            buffer_size;
    for (lVar16 = 0; sVar3 << 2 != lVar16; lVar16 = lVar16 + 4) {
      pSVar12 = Compiler::get<spirv_cross::SPIRVariable>
                          (&this->super_Compiler,*(uint32_t *)((long)&pTVar2->id + lVar16));
      pSVar12->deferred_declaration = false;
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_function(SPIRFunction &func, const Bitset &return_flags)
{
	// Avoid potential cycles.
	if (func.active)
		return;
	func.active = true;

	// If we depend on a function, emit that function before we emit our own function.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			if (op == OpFunctionCall)
			{
				// Recursively emit functions which are called.
				uint32_t id = ops[2];
				emit_function(get<SPIRFunction>(id), ir.meta[ops[1]].decoration.decoration_flags);
			}
		}
	}

	if (func.entry_line.file_id != 0)
		emit_line_directive(func.entry_line.file_id, func.entry_line.line_literal);
	emit_function_prototype(func, return_flags);
	begin_scope();

	if (func.self == ir.default_entry_point)
		emit_entry_point_declarations();

	current_function = &func;
	auto &entry_block = get<SPIRBlock>(func.entry_block);

	sort(begin(func.constant_arrays_needed_on_stack), end(func.constant_arrays_needed_on_stack));
	for (auto &array : func.constant_arrays_needed_on_stack)
	{
		auto &c = get<SPIRConstant>(array);
		auto &type = get<SPIRType>(c.constant_type);
		statement(variable_decl(type, join("_", array, "_array_copy")), " = ", constant_expression(c), ";");
	}

	for (auto &v : func.local_variables)
	{
		auto &var = get<SPIRVariable>(v);
		var.deferred_declaration = false;

		if (variable_decl_is_remapped_storage(var, StorageClassWorkgroup))
		{
			// Special variable type which cannot have initializer,
			// need to be declared as standalone variables.
			// Comes from MSL which can push global variables as local variables in main function.
			add_local_variable_name(var.self);
			statement(variable_decl(var), ";");
			var.deferred_declaration = false;
		}
		else if (var.storage == StorageClassPrivate)
		{
			// These variables will not have had their CFG usage analyzed, so move it to the entry block.
			// Comes from MSL which can push global variables as local variables in main function.
			// We could just declare them right now, but we would miss out on an important initialization case which is
			// LUT declaration in MSL.
			// If we don't declare the variable when it is assigned we're forced to go through a helper function
			// which copies elements one by one.
			add_local_variable_name(var.self);

			if (var.initializer)
			{
				statement(variable_decl(var), ";");
				var.deferred_declaration = false;
			}
			else
			{
				auto &dominated = entry_block.dominated_variables;
				if (find(begin(dominated), end(dominated), var.self) == end(dominated))
					entry_block.dominated_variables.push_back(var.self);
				var.deferred_declaration = true;
			}
		}
		else if (var.storage == StorageClassFunction && var.remapped_variable && var.static_expression)
		{
			// No need to declare this variable, it has a static expression.
			var.deferred_declaration = false;
		}
		else if (expression_is_lvalue(v))
		{
			add_local_variable_name(var.self);

			// Loop variables should never be declared early, they are explicitly emitted in a loop.
			if (var.initializer && !var.loop_variable)
				statement(variable_decl_function_local(var), ";");
			else
			{
				// Don't declare variable until first use to declutter the GLSL output quite a lot.
				// If we don't touch the variable before first branch,
				// declare it then since we need variable declaration to be in top scope.
				var.deferred_declaration = true;
			}
		}
		else
		{
			// HACK: SPIR-V in older glslang output likes to use samplers and images as local variables, but GLSL does not allow this.
			// For these types (non-lvalue), we enforce forwarding through a shadowed variable.
			// This means that when we OpStore to these variables, we just write in the expression ID directly.
			// This breaks any kind of branching, since the variable must be statically assigned.
			// Branching on samplers and images would be pretty much impossible to fake in GLSL.
			var.statically_assigned = true;
		}

		var.loop_variable_enable = false;

		// Loop variables are never declared outside their for-loop, so block any implicit declaration.
		if (var.loop_variable)
		{
			var.deferred_declaration = false;
			// Need to reset the static expression so we can fallback to initializer if need be.
			var.static_expression = 0;
		}
	}

	// Enforce declaration order for regression testing purposes.
	for (auto &block_id : func.blocks)
	{
		auto &block = get<SPIRBlock>(block_id);
		sort(begin(block.dominated_variables), end(block.dominated_variables));
	}

	for (auto &line : current_function->fixup_hooks_in)
		line();

	emit_block_chain(entry_block);

	end_scope();
	processing_entry_point = false;
	statement("");

	// Make sure deferred declaration state for local variables is cleared when we are done with function.
	// We risk declaring Private/Workgroup variables in places we are not supposed to otherwise.
	for (auto &v : func.local_variables)
	{
		auto &var = get<SPIRVariable>(v);
		var.deferred_declaration = false;
	}
}